

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::CreateDefaultGlobalGenerator(cmake *this)

{
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_20;
  cmGlobalGenerator *local_18;
  
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffe8);
  local_20._M_head_impl = local_18;
  SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                          &local_20);
  if (local_20._M_head_impl != (cmGlobalGenerator *)0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)&(local_20._M_head_impl)->_vptr_cmGlobalGenerator)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
    return;
  }
  return;
}

Assistant:

void cmake::CreateDefaultGlobalGenerator()
{
  auto gen = this->EvaluateDefaultGlobalGenerator();
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
  // This print could be unified for all platforms
  std::cout << "-- Building for: " << gen->GetName() << "\n";
#endif
  this->SetGlobalGenerator(std::move(gen));
}